

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  BEGIN_TESTING(clear_elements);
  do_tests(false);
  do_tests(true);
  test_random_insert();
  test_for_each_key_macro();
  test_for_each_key_safe_macro1();
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  do_tests(false);
  do_tests(true);
  test_random_insert();
  test_for_each_key_macro();
  test_for_each_key_safe_macro1();

  //TODO: test removal in for_each_key_safe

  return FINISH_TESTING();
}